

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntercomCommunicationParameters.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::IntercomCommunicationParameters::SetRecord
          (IntercomCommunicationParameters *this,GroupDestinationRecord *GDR)

{
  if (GDR != (GroupDestinationRecord *)0x0) {
    if ((this->m_pRecord != (DataTypeBase *)0x0) && (this->m_bMemoryManage == true)) {
      (*this->m_pRecord->_vptr_DataTypeBase[1])();
    }
    this->m_bMemoryManage = false;
    this->m_ui16Type = 2;
    this->m_ui16Length = 8;
    this->m_pRecord = &GDR->super_DataTypeBase;
  }
  return;
}

Assistant:

void IntercomCommunicationParameters::SetRecord( GroupDestinationRecord * GDR )
{
    if( !GDR )return;

    if( m_pRecord && m_bMemoryManage )delete m_pRecord;

    m_bMemoryManage = false;

    m_ui16Length = GroupDestinationRecord::GROUP_DESTINATION_RECORD_SIZE;

    m_ui16Type = GroupDestinationRecord_Type;

    m_pRecord = GDR;
}